

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listReporters(Config *param_1)

{
  _Rb_tree_node_base *p_Var1;
  pointer pbVar2;
  _Base_ptr p_Var3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  pointer pbVar10;
  Text wrapper;
  string local_e8;
  long local_c8;
  size_t local_c0;
  undefined1 *local_b8;
  _Rb_tree_node_base *local_b0;
  TextAttributes local_a8;
  Text local_88;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Available reports:\n",0x13);
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
  local_c8 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x18))
                       ((long *)CONCAT44(extraout_var,iVar4));
  p_Var8 = *(_Rb_tree_node_base **)(local_c8 + 0x18);
  p_Var1 = (_Rb_tree_node_base *)(local_c8 + 8);
  if (p_Var8 == p_Var1) {
    p_Var9 = (_Base_ptr)0x0;
  }
  else {
    p_Var9 = (_Base_ptr)0x0;
    p_Var6 = p_Var8;
    do {
      p_Var3 = p_Var6[1]._M_parent;
      if (p_Var6[1]._M_parent < p_Var9) {
        p_Var3 = p_Var9;
      }
      p_Var9 = p_Var3;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var1);
  }
  if (p_Var8 != p_Var1) {
    local_b8 = &p_Var9->field_0x7;
    local_c0 = 0x48 - (long)p_Var9;
    do {
      (**(code **)(**(long **)(p_Var8 + 2) + 0x18))(&local_e8);
      local_a8.tabChar = '\t';
      local_a8.initialIndent = 0;
      local_a8.indent = (size_t)local_b8;
      local_a8.width = local_c0;
      Tbc::Text::Text(&local_88,&local_e8,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_e8,((char)p_Var9 + '\x02') - (char)p_Var8[1]._M_parent);
      local_b0 = p_Var8;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      pbVar2 = local_88.lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = local_88.lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
          pbVar10 = pbVar10 + 1) {
        if (pbVar10 !=
            local_88.lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      p_Var8 = local_b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88.lines);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
        operator_delete(local_88.str._M_dataplus._M_p);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != p_Var1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return *(size_t *)(local_c8 + 0x28);
}

Assistant:

inline bool isOk( ResultWas::OfType resultType ) {
        return ( resultType & ResultWas::FailureBit ) == 0;
    }